

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O0

int pzshape::TPZShapeDisc::NShapeF(int degree,int dimension,MShapeType type)

{
  int in_EDX;
  undefined4 in_ESI;
  int in_EDI;
  int i;
  int sum;
  int local_18;
  int local_14;
  int local_4;
  
  local_14 = 0;
  switch(in_ESI) {
  case 0:
    local_4 = 1;
    break;
  case 1:
    local_4 = in_EDI + 1;
    break;
  case 2:
    if ((in_EDX == 0) || (in_EDX == 2)) {
      local_4 = (in_EDI + 1) * (in_EDI + 1);
    }
    else {
      local_4 = ((in_EDI + 1) * (in_EDI + 2)) / 2;
    }
    break;
  case 3:
    if ((in_EDX == 0) || (in_EDX == 2)) {
      local_4 = (in_EDI + 1) * (in_EDI + 1) * (in_EDI + 1);
    }
    else {
      for (local_18 = 0; local_18 < in_EDI + 1; local_18 = local_18 + 1) {
        local_14 = ((local_18 + 1) * (local_18 + 2)) / 2 + local_14;
      }
      local_4 = local_14;
    }
    break;
  default:
    std::operator<<((ostream *)&std::cerr,"TPZShapeDisc::NShapeF case does not exists\n");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int  TPZShapeDisc::NShapeF(int degree, int dimension, MShapeType type) {
  int sum =0,i;
  switch(dimension) {
  case 0:
      return 1;
  case 1:
    return degree+1;
//    break;
  case 2:
    if(type == ETensorial || type == ETensorialFull) return (degree+1)*(degree+1);
    else return (degree+1)*(degree+2)/2;
//    break;
  case 3:
    if(type == ETensorial || type == ETensorialFull) return (degree+1)*(degree+1)*(degree+1);
    for(i=0;i<(degree+1);i++) sum += (i+1)*(i+2)/2;
    return sum;
 //   break;
  default:
      PZError << "TPZShapeDisc::NShapeF case does not exists\n";
      return -1;
  }
//  return -1;
}